

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-version.c
# Opt level: O2

void test_bson_version(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  FILE *pFVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  
  iVar2 = bson_get_major_version();
  pFVar6 = _stderr;
  if (iVar2 == 1) {
    iVar2 = bson_get_minor_version();
    pFVar6 = _stderr;
    if (iVar2 == 10) {
      iVar2 = bson_get_micro_version();
      pFVar6 = _stderr;
      if (iVar2 == 0) {
        pcVar4 = (char *)bson_get_version();
        if (pcVar4 != "1.10.0-dev") {
          pcVar4 = (char *)bson_get_version();
          iVar2 = strcmp(pcVar4,"1.10.0-dev");
          pFVar6 = _stderr;
          if (iVar2 != 0) {
            uVar8 = bson_get_version();
            fprintf(pFVar6,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",uVar8,"1.10.0-dev");
            abort();
          }
        }
        cVar1 = bson_check_version(1,10,0);
        if (cVar1 == '\0') {
          pcVar4 = 
          "bson_check_version ( BSON_MAJOR_VERSION, BSON_MINOR_VERSION, BSON_MICRO_VERSION)";
          uVar8 = 0xe;
        }
        else {
          cVar1 = bson_check_version(1,0xb,0);
          if (cVar1 == '\0') {
            return;
          }
          pcVar4 = 
          "!bson_check_version ( BSON_MAJOR_VERSION, BSON_MINOR_VERSION + 1, BSON_MICRO_VERSION)";
          uVar8 = 0x11;
        }
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-version.c"
                ,uVar8,"test_bson_version",pcVar4);
        abort();
      }
      uVar3 = bson_get_micro_version();
      uVar5 = (ulong)uVar3;
      uVar8 = 0;
      uVar7 = 10;
    }
    else {
      uVar3 = bson_get_minor_version();
      uVar8 = 10;
      uVar5 = (ulong)uVar3;
      uVar7 = 9;
    }
  }
  else {
    uVar3 = bson_get_major_version();
    uVar8 = 1;
    uVar5 = (ulong)uVar3;
    uVar7 = 8;
  }
  fprintf(pFVar6,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",uVar5,"==",uVar8,
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-version.c"
          ,uVar7,"test_bson_version");
  abort();
}

Assistant:

static void
test_bson_version (void)
{
   ASSERT_CMPINT (bson_get_major_version (), ==, BSON_MAJOR_VERSION);
   ASSERT_CMPINT (bson_get_minor_version (), ==, BSON_MINOR_VERSION);
   ASSERT_CMPINT (bson_get_micro_version (), ==, BSON_MICRO_VERSION);
   ASSERT_CMPSTR (bson_get_version (), BSON_VERSION_S);

   ASSERT (bson_check_version (
      BSON_MAJOR_VERSION, BSON_MINOR_VERSION, BSON_MICRO_VERSION));

   ASSERT (!bson_check_version (
      BSON_MAJOR_VERSION, BSON_MINOR_VERSION + 1, BSON_MICRO_VERSION));
}